

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O0

char * Corrade::Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
                 (Array<char,_void_(*)(char_*,_unsigned_long)> *array,type_conflict2 *value)

{
  type_conflict2 *ptVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *output;
  type_conflict2 *ptVar4;
  Flags local_41;
  Error local_40;
  type_conflict2 *local_18;
  type_conflict2 *value_local;
  Array<char,_void_(*)(char_*,_unsigned_long)> *array_local;
  
  local_18 = value;
  value_local = (type_conflict2 *)array;
  pcVar2 = Array<char,_void_(*)(char_*,_unsigned_long)>::data(array);
  sVar3 = arrayCapacity<char,Corrade::Containers::ArrayMallocAllocator<char>>
                    ((Array<char,_void_(*)(char_*,_unsigned_long)> *)value_local);
  ptVar1 = value_local;
  if ((ulong)((long)value - (long)pcVar2) < sVar3) {
    output = Utility::Error::defaultOutput();
    EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_41);
    Utility::Error::Error(&local_40,output,local_41);
    Utility::Debug::operator<<
              (&local_40.super_Debug,
               "Containers::arrayAppend(): use the list variant to append values from within the array itself"
              );
    Utility::Error::~Error(&local_40);
    abort();
  }
  ptVar4 = Utility::move<char&>(local_18);
  pcVar2 = arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>,char>(ptVar1,ptVar4);
  return pcVar2;
}

Assistant:

inline T& arrayAppend(Array<T>& array, typename std::common_type<T>::type&& value) {
    CORRADE_DEBUG_ASSERT(std::size_t(&value - array.data()) >= (arrayCapacity<T, Allocator>(array)),
        "Containers::arrayAppend(): use the list variant to append values from within the array itself", *array.data());
    return arrayAppend<T, Allocator>(array, Corrade::InPlaceInit, Utility::move(value));
}